

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Packets.h
# Opt level: O2

void __thiscall ThrowPacket::ThrowPacket(ThrowPacket *this,ptr<Value> *value)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_8;
  
  local_8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (value->super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (value->super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (value->super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  (value->super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_CarrierPacket).value.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar1;
  (this->super_CarrierPacket).value.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_8);
  return;
}

Assistant:

explicit ThrowPacket(ptr<Value> value) : CarrierPacket(std::move(value)) { }